

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS
ref_node_eliminate_active_parts
          (REF_INT n,REF_INT *counts,REF_INT chunk,REF_INT active0,REF_INT *active1,REF_INT *nactive
          )

{
  bool bVar1;
  REF_INT *nactive_local;
  REF_INT *active1_local;
  REF_INT active0_local;
  REF_INT chunk_local;
  REF_INT *counts_local;
  REF_INT n_local;
  
  *nactive = counts[active0];
  *active1 = active0 + 1;
  while( true ) {
    bVar1 = false;
    if (*active1 < n) {
      bVar1 = *nactive + counts[*active1] <= chunk;
    }
    if (!bVar1) break;
    *nactive = counts[*active1] + *nactive;
    *active1 = *active1 + 1;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_node_eliminate_active_parts(REF_INT n, REF_INT *counts,
                                                   REF_INT chunk,
                                                   REF_INT active0,
                                                   REF_INT *active1,
                                                   REF_INT *nactive) {
  (*nactive) = counts[active0];
  (*active1) = active0 + 1;
  while ((*active1) < n && ((*nactive) + counts[(*active1)]) <= chunk) {
    (*nactive) += counts[(*active1)];
    (*active1)++;
  }

  return REF_SUCCESS;
}